

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O2

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
               (Context *context,Printer *printer,Descriptor *descriptor,bool immutable,
               string *suffix)

{
  string local_40;
  allocator local_19;
  
  if ((*(long *)(descriptor + 0x18) == 0) &&
     (*(char *)(*(long *)(*(long *)(descriptor + 0x10) + 0x88) + 0x98) == '\x01')) {
    if ((context->options_).annotate_code == true) {
      AnnotationFileName<google::protobuf::Descriptor>(&local_40,descriptor,suffix);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,"",&local_19);
    }
    PrintGeneratedAnnotation(printer,'$',&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const std::string& suffix = "") {
  if (IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             context->options().annotate_code
                                 ? AnnotationFileName(descriptor, suffix)
                                 : "");
  }
}